

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O1

void __thiscall MPEGSequenceHeader::setFrameRate(MPEGSequenceHeader *this,uint8_t *buff,double fps)

{
  double dVar1;
  long lVar2;
  ostream *poVar3;
  undefined4 *puVar4;
  char cVar5;
  double *pdVar6;
  ostringstream ss;
  undefined1 *local_1b8;
  undefined8 local_1b0;
  undefined1 local_1a8;
  undefined7 uStack_1a7;
  undefined8 uStack_1a0;
  double local_198;
  ostringstream local_190 [376];
  
  if (3e-05 <= ABS(23.97602397602397 - fps)) {
    cVar5 = -1;
    pdVar6 = frame_rates + 2;
    lVar2 = 0;
    do {
      if (lVar2 == -7) goto LAB_001bff4e;
      dVar1 = *pdVar6;
      lVar2 = lVar2 + -1;
      cVar5 = cVar5 + -1;
      pdVar6 = pdVar6 + 1;
    } while (3e-05 <= ABS(dVar1 - fps));
    this->frame_rate_index = -cVar5;
    buff[3] = (buff[3] & 0xf0) - cVar5;
    if (6 < (ulong)-lVar2 && lVar2 != -7) {
LAB_001bff4e:
      local_198 = fps;
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"Can\'t set fps to value ",0x17);
      poVar3 = std::ostream::_M_insert<double>(local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,". Only standard fps values allowed for mpeg2 streams.",0x35);
      puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar4 = 0x15e;
      *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
      if (local_1b8 == &local_1a8) {
        *(ulong *)(puVar4 + 6) = CONCAT71(uStack_1a7,local_1a8);
        *(undefined8 *)(puVar4 + 8) = uStack_1a0;
      }
      else {
        *(undefined1 **)(puVar4 + 2) = local_1b8;
        *(ulong *)(puVar4 + 6) = CONCAT71(uStack_1a7,local_1a8);
      }
      *(undefined8 *)(puVar4 + 4) = local_1b0;
      local_1a8 = 0;
      __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
  }
  else {
    this->frame_rate_index = '\x01';
    buff[3] = (buff[3] & 0xf0) + 1;
  }
  return;
}

Assistant:

void MPEGSequenceHeader::setFrameRate(uint8_t* buff, const double fps)
{
    for (uint8_t i = 1; i < 9; i++)
        if (std::abs(frame_rates[i] - fps) < FRAME_RATE_EPS)
        {
            frame_rate_index = i;
            buff[3] = (buff[3] & 0xf0) + i;
            return;
        }
    THROW(ERR_MPEG2_ERR_FPS,
          "Can't set fps to value " << fps << ". Only standard fps values allowed for mpeg2 streams.")
}